

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::block(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  long *plVar3;
  char cVar4;
  uint uVar5;
  basic_fstream<char,_std::char_traits<char>_> *pbVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  long lVar10;
  bool bVar11;
  Cell u;
  string fileContent;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  char buffer [1024];
  _Rb_tree_color local_46c;
  long *local_468;
  uint local_460;
  undefined4 uStack_45c;
  long local_458 [2];
  basic_fstream<char,_std::char_traits<char>_> *local_448;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_440;
  undefined1 local_438 [1032];
  
  requireDStackDepth(this,1,"BLOCK");
  requireDStackAvailable(this,1,"BLOCK");
  this_00 = &this->dStack;
  local_46c = ForthStack<unsigned_int>::getTop(this_00);
  if (local_46c != _S_red) {
    p_Var1 = &(this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header;
    p_Var9 = (this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var8 = &p_Var1->_M_header;
    for (; p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[bVar11]) {
      bVar11 = p_Var9[1]._M_color < local_46c;
      if (!bVar11) {
        p_Var8 = p_Var9;
      }
    }
    p_Var9 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var8 != p_Var1) && (p_Var9 = p_Var8, local_46c < p_Var8[1]._M_color))
    {
      p_Var9 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var9 == p_Var1) {
      pbVar6 = (basic_fstream<char,_std::char_traits<char>_> *)operator_new(0x210);
      std::fstream::fstream(pbVar6,(string *)&this->blockFileName,_S_in|_S_bin);
      local_448 = pbVar6;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::fstream*>
                (&local_440,pbVar6);
      pbVar6 = local_448;
      cVar4 = std::__basic_file<char>::is_open();
      if (cVar4 != '\0') {
        std::istream::seekg((long)pbVar6,(local_46c - _S_black) * 0x400);
        std::istream::read((char *)local_448,(long)local_438);
        lVar10 = *(long *)(local_448 + 8);
        std::fstream::close();
        local_468 = local_458;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_468,local_438,local_438 + lVar10);
        ForthStack<unsigned_int>::setTop(this_00,local_460);
        memAllocate(this);
        ForthStack<unsigned_int>::getTop(this_00);
        ForthStack<unsigned_int>::pop(this_00);
        uVar5 = ForthStack<unsigned_int>::getTop(this_00);
        plVar3 = local_468;
        if (CONCAT44(uStack_45c,local_460) != 0) {
          lVar10 = 0;
          do {
            dataSpaceSet(this,(int)lVar10 + uVar5,*(Char *)((long)plVar3 + lVar10));
            lVar10 = lVar10 + 1;
          } while (CONCAT44(uStack_45c,local_460) != lVar10);
        }
        _Var2 = local_46c;
        pmVar7 = std::
                 map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
                 ::operator[](&this->blocksInProcess,&local_46c);
        pmVar7->blockNumber = _Var2;
        pmVar7->blockLocation = uVar5;
        *(undefined4 *)&pmVar7->blockModified = 0;
        if (local_468 != local_458) {
          operator_delete(local_468,local_458[0] + 1);
        }
      }
      if (local_440._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_440._M_pi);
      }
    }
    else {
      ForthStack<unsigned_int>::setTop(this_00,*(uint *)&p_Var9[1]._M_parent);
    }
    this->blockCurrent = local_46c;
  }
  return;
}

Assistant:

void block(){
			REQUIRE_DSTACK_DEPTH(1, "BLOCK");
			REQUIRE_DSTACK_AVAILABLE(1, "BLOCK");
			Cell u=dStack.getTop();
			if(u>0){
				auto foundIt=blocksInProcess.find(u);
				if(foundIt!=blocksInProcess.end()){
					dStack.setTop((*foundIt).second.blockLocation);	
				} else {	
				std::shared_ptr<std::fstream> f{ new std::fstream(blockFileName, std::ios_base::in | std::ios_base::binary) };
					if (f->is_open()) {
						f->seekg(static_cast<size_t>(u-1)*1024L , std::ios_base::beg);
						char buffer[1024];
						f->read(buffer,1024);   // read from the file
						auto readBytes=f->gcount();
						f->close();
						std::string fileContent{buffer,static_cast<size_t>(readBytes)};
						// get memory
						dStack.setTop(fileContent.size());
						memAllocate();	
						auto ec=dStack.getTop();pop();
						// copy to memory
						auto address=dStack.getTop();
						moveIntoDataSpace(address,fileContent.c_str(),fileContent.size());
						// save block info
						struct BlockInfo newBlock {};
						newBlock.blockNumber = u;
						newBlock.blockLocation = address;
						newBlock.blockModified = false;
						blocksInProcess[u] = newBlock;
						// push address - address already on stack top
					}
				}
				blockCurrent = u;
			}
		}